

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O3

bool __thiscall
QMainWindowLayoutSeparatorHelper<QMainWindowLayout>::windowEvent
          (QMainWindowLayoutSeparatorHelper<QMainWindowLayout> *this,QEvent *event)

{
  qsizetype *this_00;
  ushort uVar1;
  QRegion QVar2;
  bool bVar3;
  bool bVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  QWidget *pQVar8;
  QPaintDevice *pQVar9;
  QMouseEvent *e;
  long in_FS_OFFSET;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  QRegion r;
  QPainter p;
  QRegion local_48;
  Representation local_40;
  Representation RStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this[-1].movingSeparator.d.size;
  pQVar8 = QLayout::parentWidget((QLayout *)this_00);
  uVar1 = *(ushort *)(event + 8);
  bVar3 = true;
  if (uVar1 < 0x33) {
    switch(uVar1) {
    case 1:
      if (*(TimerId *)(event + 0x10) == (this->separatorMoveTimer).m_id) {
        uVar5 = QBasicTimer::stop();
        if (((this->movingSeparator).d.size != 0) &&
           (iVar6 = -(uint)((this->movingSeparatorPos).xp.m_i ==
                           (this->movingSeparatorOrigin).xp.m_i),
           iVar7 = -(uint)((this->movingSeparatorPos).yp.m_i == (this->movingSeparatorOrigin).yp.m_i
                          ), auVar12._4_4_ = iVar6, auVar12._0_4_ = iVar6, auVar12._8_4_ = iVar7,
           auVar12._12_4_ = iVar7, iVar6 = movmskpd(uVar5,auVar12), iVar6 != 3)) {
          pQVar8 = QLayout::parentWidget((QLayout *)this_00);
          QDockAreaLayout::separatorRegion((QDockAreaLayout *)&stack0xffffffffffffffc0);
          QWidget::update(pQVar8,(QRegion *)&stack0xffffffffffffffc0);
          QRegion::~QRegion((QRegion *)&stack0xffffffffffffffc0);
          QMainWindowLayoutState::operator=
                    ((QMainWindowLayoutState *)(this + 1),
                     (QMainWindowLayoutState *)&this[8].separatorMoveTimer);
          QDockAreaLayout::separatorMove
                    ((QDockAreaLayout *)&this[3].movingSeparator.d.size,&this->movingSeparator,
                     &this->movingSeparatorOrigin,&this->movingSeparatorPos);
          this->movingSeparatorPos = this->movingSeparatorOrigin;
        }
        goto LAB_0042b57d;
      }
      break;
    case 2:
      if (*(int *)(event + 0x40) == 1) {
        auVar12 = QEventPoint::position();
        dVar11 = (double)((ulong)auVar12._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar12._0_8_;
        dVar10 = dVar11;
        if (dVar11 <= -2147483648.0) {
          dVar10 = -2147483648.0;
        }
        local_40.m_i = (int)(double)(-(ulong)(2147483647.0 < dVar11) & 0x41dfffffffc00000 |
                                    ~-(ulong)(2147483647.0 < dVar11) & (ulong)dVar10);
        dVar11 = (double)((ulong)auVar12._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar12._8_8_;
        dVar10 = dVar11;
        if (dVar11 <= -2147483648.0) {
          dVar10 = -2147483648.0;
        }
        RStack_3c.m_i =
             (int)(double)(-(ulong)(2147483647.0 < dVar11) & 0x41dfffffffc00000 |
                          ~-(ulong)(2147483647.0 < dVar11) & (ulong)dVar10);
        bVar4 = startSeparatorMove(this,(QPoint *)&stack0xffffffffffffffc0);
LAB_0042b474:
        if (bVar4 != false) goto LAB_0042b4a9;
      }
      break;
    case 3:
      QEventPoint::position();
      if ((this->movingSeparator).d.size != 0) {
        QList<int>::clear(&this->movingSeparator);
        QMainWindowLayoutState::clear((QMainWindowLayoutState *)&this[8].separatorMoveTimer);
LAB_0042b4a9:
        event[0xc] = (QEvent)0x1;
        goto LAB_0042b57d;
      }
      break;
    case 5:
      auVar12 = QEventPoint::position();
      dVar11 = (double)((ulong)auVar12._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar12._0_8_;
      dVar10 = dVar11;
      if (dVar11 <= -2147483648.0) {
        dVar10 = -2147483648.0;
      }
      local_40.m_i = (int)(double)(-(ulong)(2147483647.0 < dVar11) & 0x41dfffffffc00000 |
                                  ~-(ulong)(2147483647.0 < dVar11) & (ulong)dVar10);
      dVar11 = (double)((ulong)auVar12._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar12._8_8_;
      dVar10 = dVar11;
      if (dVar11 <= -2147483648.0) {
        dVar10 = -2147483648.0;
      }
      RStack_3c.m_i =
           (int)(double)(-(ulong)(2147483647.0 < dVar11) & 0x41dfffffffc00000 |
                        ~-(ulong)(2147483647.0 < dVar11) & (ulong)dVar10);
      adjustCursor(this,(QPoint *)&stack0xffffffffffffffc0);
      if (((byte)event[0x44] & 1) != 0) {
        auVar12 = QEventPoint::position();
        dVar11 = (double)((ulong)auVar12._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar12._0_8_;
        dVar10 = dVar11;
        if (dVar11 <= -2147483648.0) {
          dVar10 = -2147483648.0;
        }
        local_40.m_i = (int)(double)(-(ulong)(2147483647.0 < dVar11) & 0x41dfffffffc00000 |
                                    ~-(ulong)(2147483647.0 < dVar11) & (ulong)dVar10);
        dVar11 = (double)((ulong)auVar12._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar12._8_8_;
        dVar10 = dVar11;
        if (dVar11 <= -2147483648.0) {
          dVar10 = -2147483648.0;
        }
        RStack_3c.m_i =
             (int)(double)(-(ulong)(2147483647.0 < dVar11) & 0x41dfffffffc00000 |
                          ~-(ulong)(2147483647.0 < dVar11) & (ulong)dVar10);
        bVar4 = separatorMove(this,(QPoint *)&stack0xffffffffffffffc0);
        goto LAB_0042b474;
      }
      break;
    case 0xc:
      _local_40 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      pQVar9 = &pQVar8->super_QPaintDevice;
      if (pQVar8 == (QWidget *)0x0) {
        pQVar9 = (QPaintDevice *)0x0;
      }
      QPainter::QPainter((QPainter *)&stack0xffffffffffffffc0,pQVar9);
      local_48.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion(&local_48,(QRegion *)(event + 0x20));
      QDockAreaLayout::paintSeparators
                ((QDockAreaLayout *)&this[3].movingSeparator.d.size,
                 (QPainter *)&stack0xffffffffffffffc0,pQVar8,&local_48,&this->hoverPos);
      QRegion::~QRegion(&local_48);
      QPainter::~QPainter((QPainter *)&stack0xffffffffffffffc0);
    }
  }
  else if (uVar1 < 0x80) {
    if (uVar1 == 0x33) {
      local_40.m_i = 0;
      RStack_3c.m_i = 0;
LAB_0042b573:
      adjustCursor(this,(QPoint *)&stack0xffffffffffffffc0);
    }
    else if (uVar1 == 0x7f) goto LAB_0042b57d;
  }
  else {
    if (uVar1 == 0x80) {
      local_40.m_i = 0;
      RStack_3c.m_i = 0;
      adjustCursor(this,(QPoint *)&stack0xffffffffffffffc0);
      goto LAB_0042b57d;
    }
    if (uVar1 == 0x81) {
      auVar12 = QEventPoint::position();
      dVar11 = (double)((ulong)auVar12._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar12._0_8_;
      dVar10 = dVar11;
      if (dVar11 <= -2147483648.0) {
        dVar10 = -2147483648.0;
      }
      local_40.m_i = (int)(double)(-(ulong)(2147483647.0 < dVar11) & 0x41dfffffffc00000 |
                                  ~-(ulong)(2147483647.0 < dVar11) & (ulong)dVar10);
      dVar11 = (double)((ulong)auVar12._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar12._8_8_;
      dVar10 = dVar11;
      if (dVar11 <= -2147483648.0) {
        dVar10 = -2147483648.0;
      }
      RStack_3c.m_i =
           (int)(double)(-(ulong)(2147483647.0 < dVar11) & 0x41dfffffffc00000 |
                        ~-(ulong)(2147483647.0 < dVar11) & (ulong)dVar10);
      goto LAB_0042b573;
    }
    if ((uVar1 == 0xb7) && (this->cursorAdjusted == true)) {
      iVar6 = QCursor::shape();
      QWidget::cursor((QWidget *)&stack0xffffffffffffffc0);
      iVar7 = QCursor::shape();
      QCursor::~QCursor((QCursor *)&stack0xffffffffffffffc0);
      if (iVar6 != iVar7) {
        QWidget::cursor((QWidget *)&local_48);
        QVar2.d = local_48.d;
        local_48.d = (QRegionData *)0x0;
        _local_40 = (QPoint)(this->oldCursor).d;
        (this->oldCursor).d = (QCursorData *)QVar2.d;
        QCursor::~QCursor((QCursor *)&stack0xffffffffffffffc0);
        QCursor::~QCursor((QCursor *)&local_48);
        bVar3 = QWidget::testAttribute_helper(pQVar8,WA_SetCursor);
        this->hasOldCursor = bVar3;
        QWidget::setCursor(pQVar8,&this->adjustedCursor);
      }
    }
  }
  bVar3 = false;
LAB_0042b57d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindowLayoutSeparatorHelper<Layout>::windowEvent(QEvent *event)
{
    QWidget *w = window();
    switch (event->type()) {
    case QEvent::Paint: {
        QPainter p(w);
        QRegion r = static_cast<QPaintEvent *>(event)->region();
        layout()->dockAreaLayoutInfo()->paintSeparators(&p, w, r, hoverPos);
        break;
    }

#if QT_CONFIG(cursor)
    case QEvent::HoverMove: {
        adjustCursor(static_cast<QHoverEvent *>(event)->position().toPoint());
        break;
    }

    // We don't want QWidget to call update() on the entire QMainWindow
    // on HoverEnter and HoverLeave, hence accept the event (return true).
    case QEvent::HoverEnter:
        return true;
    case QEvent::HoverLeave:
        adjustCursor(QPoint(0, 0));
        return true;
    case QEvent::ShortcutOverride: // when a menu pops up
        adjustCursor(QPoint(0, 0));
        break;
#endif // QT_CONFIG(cursor)

    case QEvent::MouseButtonPress: {
        QMouseEvent *e = static_cast<QMouseEvent *>(event);
        if (e->button() == Qt::LeftButton && startSeparatorMove(e->position().toPoint())) {
            // The click was on a separator, eat this event
            e->accept();
            return true;
        }
        break;
    }

    case QEvent::MouseMove: {
        QMouseEvent *e = static_cast<QMouseEvent *>(event);

#if QT_CONFIG(cursor)
        adjustCursor(e->position().toPoint());
#endif
        if (e->buttons() & Qt::LeftButton) {
            if (separatorMove(e->position().toPoint())) {
                // We're moving a separator, eat this event
                e->accept();
                return true;
            }
        }

        break;
    }

    case QEvent::MouseButtonRelease: {
        QMouseEvent *e = static_cast<QMouseEvent *>(event);
        if (endSeparatorMove(e->position().toPoint())) {
            // We've released a separator, eat this event
            e->accept();
            return true;
        }
        break;
    }

#if QT_CONFIG(cursor)
    case QEvent::CursorChange:
        // CursorChange events are triggered as mouse moves to new widgets even
        // if the cursor doesn't actually change, so do not change oldCursor if
        // the "changed" cursor has same shape as adjusted cursor.
        if (cursorAdjusted && adjustedCursor.shape() != w->cursor().shape()) {
            oldCursor = w->cursor();
            hasOldCursor = w->testAttribute(Qt::WA_SetCursor);

            // Ensure our adjusted cursor stays visible
            w->setCursor(adjustedCursor);
        }
        break;
#endif // QT_CONFIG(cursor)
    case QEvent::Timer:
        if (static_cast<QTimerEvent *>(event)->timerId() == separatorMoveTimer.timerId()) {
            // let's move the separators
            separatorMoveTimer.stop();
            if (movingSeparator.isEmpty())
                return true;
            if (movingSeparatorOrigin == movingSeparatorPos)
                return true;

            // when moving the separator, we need to update the previous position
            window()->update(layout()->dockAreaLayoutInfo()->separatorRegion());

            layout()->layoutState = layout()->savedState;
            layout()->dockAreaLayoutInfo()->separatorMove(movingSeparator, movingSeparatorOrigin,
                                                          movingSeparatorPos);
            movingSeparatorPos = movingSeparatorOrigin;
            return true;
        }
        break;
    default:
        break;
    }
    return false;
}